

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t32.inc.c
# Opt level: O2

void disas_t32_extract_s_rri_rot(DisasContext_conflict1 *ctx,arg_s_rri_rot *a,uint32_t insn)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  *(uint *)&(ctx->base).pc_next = (uint)((ulong)a >> 0x14) & 1;
  *(uint *)&(ctx->base).pc_first = (uint)((ulong)a >> 0x10) & 0xf;
  *(uint *)((long)&(ctx->base).tb + 4) = (uint)((ulong)a >> 8) & 0xf;
  uVar3 = (uint)((ulong)a >> 0xf) & 0x800 | (uint)((ulong)a >> 4) & 0x700 | (uint)a & 0xff;
  iVar1 = t32_expandimm_imm((DisasContext_conflict1 *)(ulong)uVar3,(uint)a);
  *(int *)&(ctx->base).tb = iVar1;
  uVar2 = 0;
  if (0x3ff < uVar3) {
    uVar2 = uVar3 >> 7;
  }
  *(uint *)((long)&(ctx->base).pc_first + 4) = uVar2;
  return;
}

Assistant:

static void disas_t32_extract_s_rri_rot(DisasContext *ctx, arg_s_rri_rot *a, uint32_t insn)
{
    a->s = extract32(insn, 20, 1);
    a->rn = extract32(insn, 16, 4);
    a->rd = extract32(insn, 8, 4);
    a->imm = t32_expandimm_imm(ctx, deposit32(deposit32(extract32(insn, 0, 8), 8, 24, extract32(insn, 12, 3)), 11, 21, extract32(insn, 26, 1)));
    a->rot = t32_expandimm_rot(ctx, deposit32(deposit32(extract32(insn, 0, 8), 8, 24, extract32(insn, 12, 3)), 11, 21, extract32(insn, 26, 1)));
}